

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_mem.cpp
# Opt level: O2

void * __thiscall phyr::MemoryPool::alloc(MemoryPool *this,size_t byteCount)

{
  list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  *this_00;
  uint8_t *puVar1;
  size_t sVar2;
  _List_node_base *p_Var3;
  const_iterator __position;
  _List_node_base *p_Var4;
  
  p_Var3 = (_List_node_base *)(byteCount + 0xf & 0xfffffffffffffff0);
  sVar2 = this->curBlockOffset;
  if (this->curAllocSize < (long)&p_Var3->_M_next + sVar2) {
    stash(this);
    this_00 = &this->freeBlocks;
    __position._M_node = (_List_node_base *)this_00;
    do {
      __position._M_node = (__position._M_node)->_M_next;
      if (__position._M_node == (_List_node_base *)this_00) goto LAB_001025ef;
      p_Var4 = __position._M_node[1]._M_prev;
    } while (p_Var4 < p_Var3);
    this->blockPtr = (uint8_t *)__position._M_node[1]._M_next;
    this->curAllocSize = (size_t)p_Var4;
    std::__cxx11::
    list<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
    ::erase(this_00,__position);
LAB_001025ef:
    puVar1 = this->blockPtr;
    if (puVar1 == (uint8_t *)0x0) {
      p_Var4 = (_List_node_base *)this->blockSize;
      if ((_List_node_base *)this->blockSize < p_Var3) {
        p_Var4 = p_Var3;
      }
      this->curAllocSize = (size_t)p_Var4;
      puVar1 = (uint8_t *)allocAligned((size_t)p_Var4);
      this->blockPtr = puVar1;
      this->totalAllocSize = this->totalAllocSize + this->curAllocSize;
    }
    sVar2 = 0;
  }
  else {
    puVar1 = this->blockPtr;
  }
  this->curBlockOffset = (long)&p_Var3->_M_next + sVar2;
  return puVar1 + sVar2;
}

Assistant:

void* MemoryPool::alloc(size_t byteCount) {
    // Align {size} with cache line size
    // Optimized alignment calculation, as {MachineAlignment} is a power of 2
    byteCount = (byteCount + MachineAlignment - 1) & ~(MachineAlignment - 1);

    // Check if size requirement is more than what is curently available
    if (curBlockOffset + byteCount > curAllocSize) {
        // Store current block usage data
        stash();

        // Check free blocks for memory
        for (auto it = freeBlocks.begin(); it != freeBlocks.end(); it++) {
            if (it->second >= byteCount) {
                blockPtr = it->first; curAllocSize = it->second;
                // Remove this block from the free set
                freeBlocks.erase(it);
                break;
            }
        }

        // If a block has not yet been found, allocate new
        if (!blockPtr) {
            // Ensure minimum of {blockSize} bytes per block
            curAllocSize = std::max(byteCount, blockSize);
            blockPtr = allocAligned<uint8_t>(curAllocSize);
            // Increment pool size stat
            totalAllocSize += curAllocSize;
        }

        // New memory block allocated, reset block offset
        curBlockOffset = 0;
    }

    void* ptr = blockPtr + curBlockOffset;
    curBlockOffset += byteCount;
    return ptr;
}